

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O1

LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> * __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::operator=
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *vec)

{
  size_t sVar1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *__dest;
  
  if ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)this->ptr_ != this) {
    free((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)this->ptr_);
  }
  this->ptr_ = this->buffer_;
  this->size_ = 0;
  this->capacity_ = 0x10;
  sVar1 = vec->size_;
  this->size_ = sVar1;
  this->capacity_ = vec->capacity_;
  if ((LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)vec->ptr_ == vec) {
    memcpy(this,vec,sVar1 << 4);
    this->ptr_ = this->buffer_;
  }
  else {
    __dest = (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)malloc(vec->capacity_ << 4);
    this->ptr_ = __dest;
    if (__dest == (pair<unsigned_long,_const_cppjieba::DictUnit_*> *)0x0) {
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/limonp/LocalVector.hpp"
                    ,0x3e,
                    "LocalVector<T> &limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::operator=(const LocalVector<T> &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    memcpy(__dest,vec->ptr_,vec->size_ << 4);
  }
  return this;
}

Assistant:

LocalVector<T>& operator = (const LocalVector<T>& vec) {
    clear();
    size_ = vec.size();
    capacity_ = vec.capacity();
    if(vec.buffer_ == vec.ptr_) {
      memcpy(buffer_, vec.buffer_, sizeof(T) * size_);
      ptr_ = buffer_;
    } else {
      ptr_ = (T*) malloc(vec.capacity() * sizeof(T));
      assert(ptr_);
      memcpy(ptr_, vec.ptr_, vec.size() * sizeof(T));
    }
    return *this;
  }